

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

void opj_mqc_segmark_enc(opj_mqc_t *mqc)

{
  OPJ_UINT32 *pOVar1;
  uint uVar2;
  opj_mqc_state_t **ppoVar3;
  opj_mqc_state_t *poVar4;
  uint uVar5;
  uint uVar6;
  
  mqc->curctx = mqc->ctxs + 0x12;
  uVar5 = 1;
  do {
    ppoVar3 = mqc->curctx;
    poVar4 = *ppoVar3;
    uVar2 = poVar4->qeval;
    if (poVar4->mps == (uVar5 & 1)) {
      uVar6 = mqc->a - uVar2;
      mqc->a = uVar6;
      if ((short)uVar6 < 0) {
        mqc->c = mqc->c + uVar2;
      }
      else {
        if (uVar6 < uVar2) {
          mqc->a = uVar2;
        }
        else {
          mqc->c = mqc->c + uVar2;
        }
        *ppoVar3 = poVar4->nmps;
        do {
          mqc->a = mqc->a << 1;
          mqc->c = mqc->c << 1;
          pOVar1 = &mqc->ct;
          *pOVar1 = *pOVar1 - 1;
          if (*pOVar1 == 0) {
            opj_mqc_byteout(mqc);
          }
        } while ((mqc->a & 0x8000) == 0);
      }
    }
    else {
      uVar6 = mqc->a - uVar2;
      mqc->a = uVar6;
      if (uVar6 < uVar2) {
        mqc->c = mqc->c + uVar2;
      }
      else {
        mqc->a = uVar2;
      }
      *ppoVar3 = poVar4->nlps;
      do {
        mqc->a = mqc->a << 1;
        mqc->c = mqc->c << 1;
        pOVar1 = &mqc->ct;
        *pOVar1 = *pOVar1 - 1;
        if (*pOVar1 == 0) {
          opj_mqc_byteout(mqc);
        }
      } while ((mqc->a & 0x8000) == 0);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  return;
}

Assistant:

void opj_mqc_segmark_enc(opj_mqc_t *mqc)
{
    OPJ_UINT32 i;
    opj_mqc_setcurctx(mqc, 18);

    for (i = 1; i < 5; i++) {
        opj_mqc_encode(mqc, i % 2);
    }
}